

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> embree::CoronaLoader::load(FileName *fileName,AffineSpace3fa *space)

{
  CoronaLoader *in_RDI;
  CoronaLoader loader;
  AffineSpace3fa *in_stack_00000118;
  FileName *in_stack_00000120;
  CoronaLoader *in_stack_00000128;
  CoronaLoader *this;
  _func_int **local_30 [4];
  _func_int ***local_10;
  
  CoronaLoader(in_stack_00000128,in_stack_00000120,in_stack_00000118);
  local_10 = local_30;
  *(_func_int ***)&(in_RDI->path).filename = local_30[0];
  this = in_RDI;
  if (*(_func_int ***)&(in_RDI->path).filename != (_func_int **)0x0) {
    (**(code **)(**(_func_int ***)&(in_RDI->path).filename + 0x10))();
  }
  ~CoronaLoader(this);
  return (Ref<embree::SceneGraph::Node>)(Node *)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::load(const FileName& fileName, const AffineSpace3fa& space) {
    CoronaLoader loader(fileName,space); return loader.root;
  }